

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

void ShDestruct(ShHandle handle)

{
  long lVar1;
  TCompiler *compiler;
  TShHandleBase *linker;
  TUniformMap *map;
  
  if (handle != (ShHandle)0x0) {
    lVar1 = (**(code **)(*handle + 0x10))();
    if (lVar1 != 0) {
      compiler = (TCompiler *)(**(code **)(*handle + 0x10))(handle);
      DeleteCompiler(compiler);
      return;
    }
    lVar1 = (**(code **)(*handle + 0x18))(handle);
    if (lVar1 != 0) {
      linker = (TShHandleBase *)(**(code **)(*handle + 0x18))(handle);
      DeleteLinker(linker);
      return;
    }
    lVar1 = (**(code **)(*handle + 0x20))(handle);
    if (lVar1 != 0) {
      map = (TUniformMap *)(**(code **)(*handle + 0x20))(handle);
      DeleteUniformMap(map);
      return;
    }
  }
  return;
}

Assistant:

void ShDestruct(ShHandle handle)
{
    if (handle == nullptr)
        return;

    TShHandleBase* base = static_cast<TShHandleBase*>(handle);

    if (base->getAsCompiler())
        DeleteCompiler(base->getAsCompiler());
    else if (base->getAsLinker())
        DeleteLinker(base->getAsLinker());
    else if (base->getAsUniformMap())
        DeleteUniformMap(base->getAsUniformMap());
}